

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O2

void __thiscall
barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
computing_barcodes_in_dimension
          (barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          unsigned_short dimension)

{
  ostream *poVar1;
  
  if ((this->min_dimension <= dimension) && (dimension <= this->max_dimension)) {
    poVar1 = std::operator<<((ostream *)
                             &(this->
                              super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
                              ).outstream,"# persistence intervals in dimension ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dimension);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  this->current_dimension = dimension;
  return;
}

Assistant:

void computing_barcodes_in_dimension(unsigned short dimension) {
		if (dimension >= min_dimension && dimension <= max_dimension)
			file_output_t<Complex>::outstream << "# persistence intervals in dimension " << dimension << std::endl;
		current_dimension = dimension;
	}